

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

sftp_cmd_lookup * lookup_command(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  uVar4 = 0x1c;
  do {
    iVar1 = (int)uVar4;
    while( true ) {
      if (iVar1 + -1 <= (int)uVar5) {
        return (sftp_cmd_lookup *)0x0;
      }
      uVar4 = (long)((int)uVar5 + iVar1) / 2;
      iVar2 = (int)uVar4;
      uVar4 = uVar4 & 0xffffffff;
      iVar3 = strcmp(name,sftp_lookup[iVar2].name);
      if (iVar3 < 0) break;
      uVar5 = uVar4;
      if (iVar3 == 0) {
        return sftp_lookup + iVar2;
      }
    }
  } while( true );
}

Assistant:

const struct sftp_cmd_lookup *lookup_command(const char *name)
{
    int i, j, k, cmp;

    i = -1;
    j = lenof(sftp_lookup);
    while (j - i > 1) {
        k = (j + i) / 2;
        cmp = strcmp(name, sftp_lookup[k].name);
        if (cmp < 0)
            j = k;
        else if (cmp > 0)
            i = k;
        else {
            return &sftp_lookup[k];
        }
    }
    return NULL;
}